

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O2

cmd_ln_val_t * cmd_ln_val_init(int t,char *name,char *str)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  anytype_t *paVar6;
  size_t sVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  bool bVar11;
  size_t local_a8;
  char *resolved_str;
  anytype_t val;
  
  if (str == (char *)0x0) {
    val.ptr = (void *)0x0;
    goto LAB_001067db;
  }
  resolved_str = (char *)0x0;
  local_a8 = 0;
  pcVar5 = str;
  while( true ) {
    pcVar3 = strstr(pcVar5,"$(");
    if (pcVar3 == (char *)0x0) break;
    if ((long)pcVar3 - (long)pcVar5 != 0) {
      strnappend(&resolved_str,&local_a8,pcVar5,(long)pcVar3 - (long)pcVar5);
      pcVar5 = pcVar3;
    }
    pcVar3 = pcVar5 + 2;
    pcVar4 = strchr(pcVar3,0x29);
    if (pcVar4 == (char *)0x0) {
      strnappend(&resolved_str,&local_a8,pcVar5,2);
      pcVar5 = pcVar3;
    }
    else {
      sVar7 = (long)pcVar4 - (long)pcVar3;
      if ((long)sVar7 < 100) {
        strncpy((char *)&val.i,pcVar3,sVar7);
        *(undefined1 *)((long)&val + sVar7) = 0;
        pcVar5 = getenv((char *)&val.i);
        if (pcVar5 != (char *)0x0) {
          strappend(&resolved_str,&local_a8,pcVar5);
        }
      }
      pcVar5 = pcVar4 + 1;
    }
  }
  strappend(&resolved_str,&local_a8,pcVar5);
  pcVar5 = resolved_str;
  switch(t) {
  case 2:
  case 3:
    iVar2 = __isoc99_sscanf(resolved_str,"%ld",&val);
    bVar11 = iVar2 != 1;
    break;
  case 4:
  case 5:
    if ((resolved_str == (char *)0x0) || (*resolved_str == '\0')) {
      bVar11 = true;
    }
    else {
      bVar11 = false;
    }
    val.fl = atof_c(resolved_str);
    break;
  case 8:
  case 9:
    val.ptr = __ckd_salloc__(resolved_str,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                             ,0x199);
    goto LAB_001067d3;
  case 0x10:
  case 0x11:
    bVar1 = *resolved_str;
    uVar9 = bVar1 - 0x30;
    if (uVar9 < 0x3f) {
      if ((0x4040000040400001U >> ((ulong)uVar9 & 0x3f) & 1) == 0) {
        if ((0x21000000002U >> ((ulong)uVar9 & 0x3f) & 1) == 0) goto LAB_001067c0;
        goto LAB_001067ca;
      }
      val.ptr = (void *)0x0;
    }
    else {
LAB_001067c0:
      if ((bVar1 != 0x79) && (bVar1 != 0x74)) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                ,0x193,"Unparsed boolean value \'%s\'\n",str);
        goto LAB_00106709;
      }
LAB_001067ca:
      val.i = 1;
    }
LAB_001067d3:
    ckd_free(pcVar5);
    goto LAB_001067db;
  default:
    if (t == 0x20) {
      uVar9 = 1;
      pcVar3 = resolved_str;
      do {
        if (*pcVar3 == ',') {
          uVar9 = uVar9 + 1;
        }
        else if (*pcVar3 == '\0') goto LAB_00106718;
        pcVar3 = pcVar3 + 1;
      } while( true );
    }
  case 6:
  case 7:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x19f,"Unknown argument type: %d\n",(ulong)(uint)t);
LAB_00106709:
    ckd_free(pcVar5);
    goto LAB_00106711;
  }
  ckd_free(pcVar5);
  if (bVar11) {
LAB_00106711:
    paVar6 = (anytype_t *)0x0;
  }
  else {
LAB_001067db:
    paVar6 = (anytype_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x1a8);
    *paVar6 = val;
    *(int *)(paVar6 + 1) = t;
    pcVar5 = __ckd_salloc__(name,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                            ,0x1ab);
    paVar6[2].ptr = pcVar5;
  }
  return (cmd_ln_val_t *)paVar6;
LAB_00106718:
  val.ptr = __ckd_calloc__((long)(int)(uVar9 + 1),8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                           ,0x161);
  uVar8 = 0;
  pcVar3 = pcVar5;
  uVar10 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    uVar10 = uVar8;
  }
  for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
    for (sVar7 = 0; (pcVar3[sVar7] != '\0' && (pcVar3[sVar7] != ',')); sVar7 = sVar7 + 1) {
    }
    pcVar4 = (char *)__ckd_calloc__(sVar7 + 1 & 0xffffffff,1,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                    ,0x165);
    *(char **)((long)val.ptr + uVar8 * 8) = pcVar4;
    strncpy(pcVar4,pcVar3,sVar7);
    pcVar3 = pcVar3 + sVar7 + 1;
  }
  goto LAB_001067d3;
}

Assistant:

static cmd_ln_val_t *
cmd_ln_val_init(int t, const char *name, const char *str)
{
    cmd_ln_val_t *v;
    anytype_t val;
    char *e_str;

    if (!str) {
        /* For lack of a better default value. */
        memset(&val, 0, sizeof(val));
    }
    else {
        int valid = 1;
        e_str = arg_resolve_env(str);

        switch (t) {
        case ARG_INTEGER:
        case REQARG_INTEGER:
            if (sscanf(e_str, "%ld", &val.i) != 1)
                valid = 0;
            break;
        case ARG_FLOATING:
        case REQARG_FLOATING:
            if (e_str == NULL || e_str[0] == 0)
            valid = 0;
            val.fl = atof_c(e_str);
            break;
        case ARG_BOOLEAN:
        case REQARG_BOOLEAN:
            if ((e_str[0] == 'y') || (e_str[0] == 't') ||
                (e_str[0] == 'Y') || (e_str[0] == 'T') || (e_str[0] == '1')) {
                val.i = TRUE;
            }
            else if ((e_str[0] == 'n') || (e_str[0] == 'f') ||
                     (e_str[0] == 'N') || (e_str[0] == 'F') |
                     (e_str[0] == '0')) {
                val.i = FALSE;
            }
            else {
                E_ERROR("Unparsed boolean value '%s'\n", str);
                valid = 0;
            }
            break;
        case ARG_STRING:
        case REQARG_STRING:
            val.ptr = ckd_salloc(e_str);
            break;
        case ARG_STRING_LIST:
            val.ptr = parse_string_list(e_str);
            break;
        default:
            E_ERROR("Unknown argument type: %d\n", t);
            valid = 0;
        }

        ckd_free(e_str);
        if (valid == 0)
            return NULL;
    }

    v = (cmd_ln_val_t *)ckd_calloc(1, sizeof(*v));
    memcpy(v, &val, sizeof(val));
    v->type = t;
    v->name = ckd_salloc(name);

    return v;
}